

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void test_fibonacci(void)

{
  _Atomic_word *p_Var1;
  Function *pFVar2;
  int iVar3;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::VirtReg> sum;
  shared_ptr<vmips::VirtReg> res0;
  shared_ptr<vmips::VirtReg> n;
  shared_ptr<vmips::VirtReg> res1;
  shared_ptr<vmips::VirtReg> m;
  shared_ptr<vmips::VirtReg> one;
  shared_ptr<vmips::VirtReg> zero;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> br;
  Function *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  shared_ptr<vmips::VirtReg> local_e0;
  element_type *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  shared_ptr<vmips::VirtReg> local_c0;
  shared_ptr<vmips::VirtReg> local_b0;
  shared_ptr<vmips::VirtReg> local_a0;
  undefined4 local_90 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  Function local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  CFGNode local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  shared_ptr<vmips::VirtReg> local_60;
  int local_50 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_40.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  local_f0 = (Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::Function,std::allocator<vmips::Function>,char_const(&)[10],int>
            (&local_e8,&local_f0,(allocator<vmips::Function> *)&local_e0,(char (*) [10])"fibonacci",
             (int *)&local_40);
  vmips::get_special((SpecialReg)local_50);
  vmips::Function::entry();
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  local_40.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>&,int>
            ((CFGNode *)&local_60,*(shared_ptr<vmips::VirtReg> **)(local_f0 + 0x148),local_50);
  pFVar2 = local_f0;
  vmips::get_special((SpecialReg)&local_e0);
  vmips::Function::
  branch<vmips::ble,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
            (&local_40,pFVar2,&local_e0,&local_60);
  if (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pFVar2 = local_f0;
  vmips::get_special((SpecialReg)&local_e0);
  local_90[0] = 0xffffffff;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>,int>
            (local_70,*(shared_ptr<vmips::VirtReg> **)(pFVar2 + 0x148),(int *)&local_e0);
  if (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pFVar2 = local_f0;
  vmips::get_special((SpecialReg)&local_e0);
  local_a0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0xfffffffe;
  vmips::CFGNode::append<vmips::addi,std::shared_ptr<vmips::VirtReg>,int>
            ((CFGNode *)local_90,*(shared_ptr<vmips::VirtReg> **)(pFVar2 + 0x148),(int *)&local_e0);
  if (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_b0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f0;
  local_b0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_e8._M_pi;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8._M_pi)->_M_weak_count = (local_e8._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_e8._M_pi)->_M_weak_count = (local_e8._M_pi)->_M_weak_count + 1;
    }
  }
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&local_a0,(weak_ptr<vmips::Function> *)local_f0,&local_b0);
  if (local_b0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_b0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_b0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_b0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_b0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  local_c0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_f0;
  local_c0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_e8._M_pi;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8._M_pi)->_M_weak_count = (local_e8._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_e8._M_pi)->_M_weak_count = (local_e8._M_pi)->_M_weak_count + 1;
    }
  }
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            (local_80,(weak_ptr<vmips::Function> *)local_f0,&local_c0);
  if (local_c0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_c0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_c0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_c0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_c0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  vmips::CFGNode::
  append<vmips::add,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            ((CFGNode *)&local_e0,*(shared_ptr<vmips::VirtReg> **)(local_f0 + 0x148),&local_a0);
  local_d0 = local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c8 = local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  vmips::Function::assign_special(local_f0,2,&local_d0);
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  vmips::Function::add_ret();
  vmips::Function::switch_to(local_f0);
  vmips::Function::assign_special((SpecialReg)local_f0,2);
  vmips::Function::output((ostream *)local_f0);
  vmips::Function::color();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::output((ostream *)local_f0);
  vmips::Function::scan_overlap();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::output((ostream *)local_f0);
  vmips::Function::handle_alloca();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  vmips::Function::output((ostream *)local_f0);
  if (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_a0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_40.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.second.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.first.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_60.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  return;
}

Assistant:

void test_fibonacci() {
    auto f  = std::make_shared<Function>("fibonacci", 1);
    auto zero = get_special(SpecialReg::zero);
    f->entry();
    auto one = f->append<addi>(zero, 1);
    auto br = f->branch<ble>(get_special(SpecialReg::a0), one);

    // arg > 1
    auto m = f->append<addi>(get_special(SpecialReg::a0), -1);
    auto n = f->append<addi>(get_special(SpecialReg::a0), -2);
    auto res0 = f->call(f, m);
    auto res1 = f->call(f, n);
    auto sum = f->append<add>(res0, res1);
    f->assign_special(SpecialReg::v0, sum);
    f->add_ret();

    // arg <= 1
    f->switch_to(br.second);
    f->assign_special(SpecialReg::v0, 1);

    f->output(std::cout);

    f->color();
    std::cout << std::endl;
    f->output(std::cout);

    f->scan_overlap();
    std::cout << std::endl;
    f->output(std::cout);

    f->handle_alloca();
    std::cout << std::endl;
    f->output(std::cout);

}